

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O3

void __thiscall
ArgsManager::logArgsPrefix
          (ArgsManager *this,string *prefix,string *section,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  string_view source_file;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  optional<unsigned_int> oVar5;
  Logger *pLVar6;
  _Rb_tree_node_base *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Rb_tree_header *p_Var9;
  _Base_ptr p_Var10;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string value_str;
  string section_str;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined1 local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [3];
  undefined8 local_98;
  char *pcStack_90;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (section->_M_string_length == 0) {
    local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
  }
  else {
    std::operator+(&local_58,"[",section);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_58,"] ");
    local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar4->_M_dataplus)._M_p;
    paVar8 = &pbVar4->field_2;
    if (paVar1 == paVar8) {
      local_f8[0].field_2._0_8_ = paVar8->_M_allocated_capacity;
      local_f8[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    }
    else {
      local_f8[0].field_2._0_8_ = paVar8->_M_allocated_capacity;
      local_f8[0]._M_dataplus._M_p = (pointer)paVar1;
    }
    local_f8[0]._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  p_Var7 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(args->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      p_Var10 = *(_Base_ptr *)(p_Var7 + 2);
      p_Var2 = p_Var7[2]._M_parent;
      if (p_Var10 != p_Var2) {
        do {
          std::operator+(&local_58,'-',
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var7 + 1));
          oVar5 = GetArgFlags(this,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          if (((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
            if ((oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload >> 10 & 1) == 0) {
              UniValue::write_abi_cxx11_((UniValue *)local_118,(int)p_Var10,(void *)0x0,0);
            }
            else {
              local_118._0_8_ = local_118 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"****","");
            }
            pLVar6 = LogInstance();
            bVar3 = BCLog::Logger::Enabled(pLVar6);
            if (bVar3) {
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              local_58._M_string_length = 0;
              local_58.field_2._M_local_buf[0] = '\0';
              tinyformat::
              format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                        (&local_78,(tinyformat *)"%s %s%s=%s\n",(char *)prefix,local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var7 + 1),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,in_stack_fffffffffffffea8);
              logArgsPrefix();
              pLVar6 = LogInstance();
              local_98 = 0x58;
              pcStack_90 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
              ;
              in_stack_fffffffffffffea8 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x58;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
              ;
              source_file._M_len = 0x58;
              str._M_str = local_58._M_dataplus._M_p;
              str._M_len = local_58._M_string_length;
              logging_function._M_str = "logArgsPrefix";
              logging_function._M_len = 0xd;
              BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x34e,ALL,Info);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
              }
            }
            if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
              operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
            }
          }
          p_Var10 = (_Base_ptr)&p_Var10[2]._M_right;
        } while (p_Var10 != p_Var2);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
    operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ArgsManager::logArgsPrefix(
    const std::string& prefix,
    const std::string& section,
    const std::map<std::string, std::vector<common::SettingsValue>>& args) const
{
    std::string section_str = section.empty() ? "" : "[" + section + "] ";
    for (const auto& arg : args) {
        for (const auto& value : arg.second) {
            std::optional<unsigned int> flags = GetArgFlags('-' + arg.first);
            if (flags) {
                std::string value_str = (*flags & SENSITIVE) ? "****" : value.write();
                LogPrintf("%s %s%s=%s\n", prefix, section_str, arg.first, value_str);
            }
        }
    }
}